

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O2

Roaring64Map * __thiscall
doublechecked::Roaring64Map::operator-=(Roaring64Map *this,Roaring64Map *r)

{
  _Base_ptr p_Var1;
  unsigned_long value;
  key_type_conflict local_30;
  
  roaring::Roaring64Map::operator-=(&this->plain,&r->plain);
  for (p_Var1 = (r->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(r->check)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    local_30 = *(key_type_conflict *)(p_Var1 + 1);
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::erase(&(this->check)._M_t,&local_30);
  }
  return this;
}

Assistant:

Roaring64Map &operator-=(const Roaring64Map &r) {
        plain -= r.plain;

        for (auto value : r.check)
            check.erase(value);  // Note std::remove() is not for ordered sets

        return *this;
    }